

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

int __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::shutdown(thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  undefined1 local_20 [8];
  lock_guard locker;
  thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  
  locker.m_lock._8_8_ = this;
  thread_mixin::lock_guard::lock_guard((lock_guard *)local_20,(thread_mixin *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &(this->
                      super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                      ).super_type.m_thread);
  if ((bVar1) && ((this->m_shutdown & 1U) == 0)) {
    this->m_shutdown = true;
    thread_mixin::notify((thread_mixin *)this);
  }
  thread_mixin::lock_guard::~lock_guard((lock_guard *)local_20);
  return extraout_EAX;
}

Assistant:

void
	shutdown()
	{
		typename base_type::lock_guard locker{ *this };

		if( this->m_thread && !this->m_shutdown )
		{
			this->m_shutdown = true;
			this->notify();
		}
	}